

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  char *pcVar1;
  byte bVar2;
  size_t max_headers;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 in_RAX;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  char *pcVar10;
  int r;
  undefined8 uStack_38;
  
  pcVar7 = buf_start + len;
  max_headers = *num_headers;
  iVar9 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar6 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar6 = buf_start;
    }
    do {
      if (pcVar6 == pcVar7) {
        return -2;
      }
      pcVar10 = pcVar6 + 1;
      if (*pcVar6 == '\n') {
LAB_00107ed3:
        iVar5 = iVar9 + 1;
      }
      else {
        iVar5 = 0;
        if (*pcVar6 == '\r') {
          if (pcVar10 == pcVar7) {
            return -2;
          }
          if (*pcVar10 != '\n') {
            return -1;
          }
          pcVar10 = pcVar6 + 2;
          goto LAB_00107ed3;
        }
      }
      iVar9 = iVar5;
      pcVar6 = pcVar10;
    } while (iVar9 != 2);
  }
  if (len == 0) {
LAB_00107f01:
    uStack_38 = 0xfffffffe00000000;
  }
  else {
    if (*buf_start != '\n') {
      pcVar6 = buf_start;
      if (*buf_start != '\r') goto LAB_00107f1f;
      if (len == 1) goto LAB_00107f01;
      if (buf_start[1] == '\n') {
        pcVar6 = buf_start + 2;
        goto LAB_00107f1f;
      }
      goto LAB_0010808b;
    }
    pcVar6 = buf_start + 1;
LAB_00107f1f:
    uStack_38._0_4_ = (undefined4)in_RAX;
    if (pcVar6 == pcVar7) {
      uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
LAB_00107f6d:
      bVar3 = false;
    }
    else {
      sVar8 = 0;
      do {
        bVar2 = pcVar6[sVar8];
        if (bVar2 == 0x20) {
          *method = pcVar6;
          *method_len = sVar8;
          pcVar6 = pcVar6 + sVar8;
          bVar3 = true;
          uStack_38 = in_RAX;
          goto LAB_00107f8b;
        }
        if ((bVar2 - 0x7f < 0xffffffa1) && ((bVar2 < 0x20 || (bVar2 == 0x7f)))) {
          uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
          pcVar6 = pcVar6 + sVar8;
          goto LAB_00107f6d;
        }
        lVar4 = sVar8 + 1;
        sVar8 = sVar8 + 1;
      } while (pcVar6 + lVar4 != pcVar7);
      uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
      bVar3 = false;
      pcVar6 = pcVar7;
    }
LAB_00107f8b:
    if (bVar3) {
      pcVar6 = pcVar6 + 1;
      do {
        pcVar10 = pcVar6;
        if (pcVar10 == pcVar7) goto LAB_00107f01;
        pcVar6 = pcVar10 + 1;
      } while (*pcVar10 == ' ');
      sVar8 = 0;
      do {
        bVar2 = pcVar10[sVar8];
        if (bVar2 == 0x20) {
          *path = pcVar10;
          *path_len = sVar8;
LAB_00108014:
          pcVar6 = pcVar6 + (sVar8 - 1);
          goto LAB_00108027;
        }
        if ((bVar2 - 0x7f < 0xffffffa1) && ((bVar2 < 0x20 || (bVar2 == 0x7f)))) {
          uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
          goto LAB_00108014;
        }
        pcVar1 = pcVar6 + sVar8;
        sVar8 = sVar8 + 1;
      } while (pcVar1 != pcVar7);
      uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
      pcVar6 = pcVar7;
LAB_00108027:
      if (bVar2 == 0x20) {
        do {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == pcVar7) goto LAB_00107f01;
        } while (*pcVar6 == ' ');
        if ((*method_len != 0) && (*path_len != 0)) {
          pcVar6 = parse_http_version(pcVar6,pcVar7,minor_version,(int *)((long)&uStack_38 + 4));
          if (pcVar6 == (char *)0x0) goto LAB_00108093;
          if (*pcVar6 == '\n') {
            pcVar6 = pcVar6 + 1;
LAB_001080b4:
            pcVar7 = parse_headers(pcVar6,pcVar7,headers,num_headers,max_headers,
                                   (int *)((long)&uStack_38 + 4));
            goto LAB_00108095;
          }
          if (*pcVar6 == '\r') {
            if (pcVar6 + 1 == pcVar7) goto LAB_00107f01;
            if (pcVar6[1] == '\n') {
              pcVar6 = pcVar6 + 2;
              goto LAB_001080b4;
            }
          }
        }
LAB_0010808b:
        uStack_38 = 0xffffffff00000000;
      }
    }
  }
LAB_00108093:
  pcVar7 = (char *)0x0;
LAB_00108095:
  if (pcVar7 != (char *)0x0) {
    uStack_38._4_4_ = (int)pcVar7 - (int)buf_start;
  }
  return uStack_38._4_4_;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method, size_t *method_len, const char **path,
                      size_t *path_len, int *minor_version, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf_start + len;
    size_t max_headers = *num_headers;
    int r;

    *method = NULL;
    *method_len = 0;
    *path = NULL;
    *path_len = 0;
    *minor_version = -1;
    *num_headers = 0;

    /* if last_len != 0, check if the request is complete (a fast countermeasure
       againt slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len, minor_version, headers, num_headers, max_headers,
                             &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}